

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_iterators.h
# Opt level: O1

void __thiscall
st_tree::detail::
b1st_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::allocator<int>_>
::b1st_iterator(b1st_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::allocator<int>_>
                *this,value_type *root)

{
  value_type *local_18;
  
  this->_vptr_b1st_iterator = (_func_int **)&PTR__b1st_iterator_003114b8;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_queue).
  super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ::_M_initialize_map(&(this->_queue).
                       super__Deque_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
                      ,0);
  if (root != (value_type *)0x0) {
    local_18 = root;
    std::
    deque<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*,std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>>
    ::
    emplace_back<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>
              ((deque<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*,std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>>
                *)&this->_queue,&local_18);
  }
  return;
}

Assistant:

b1st_iterator(value_type* root) {
        if (root == NULL) return;
        _queue.push_back(const_cast<node_type*>(root));
    }